

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O3

int Dau_DecCheckSetTop5(word *p,int nVars,int nVarsF,int nVarsB,int nVarsS,int uMaskS,int *pSched,
                       word *pDec,word *pComp)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  int pVarsS [16];
  word Cof [2] [64];
  byte abStack_4b8 [64];
  byte abStack_478 [64];
  ulong auStack_438 [64];
  ulong auStack_238 [65];
  
  bVar6 = (byte)nVarsF;
  uVar3 = 1 << ((byte)nVarsB & 0x1f);
  uVar16 = 1 << ((byte)nVarsS & 0x1f);
  if (nVarsB + nVarsF != nVars) {
    __assert_fail("nVars == nVarsB + nVarsF",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauNonDsd.c"
                  ,0x38,
                  "int Dau_DecCheckSetTop5(word *, int, int, int, int, int, int *, word *, word *)")
    ;
  }
  if (0x10 < nVars) {
    __assert_fail("nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauNonDsd.c"
                  ,0x39,
                  "int Dau_DecCheckSetTop5(word *, int, int, int, int, int, int *, word *, word *)")
    ;
  }
  if (6 < nVarsS) {
    __assert_fail("nVarsS <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauNonDsd.c"
                  ,0x3a,
                  "int Dau_DecCheckSetTop5(word *, int, int, int, int, int, int *, word *, word *)")
    ;
  }
  if (4 < nVarsF - 1U) {
    __assert_fail("nVarsF >= 1 && nVarsF <= 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauNonDsd.c"
                  ,0x3b,
                  "int Dau_DecCheckSetTop5(word *, int, int, int, int, int, int *, word *, word *)")
    ;
  }
  if (nVarsB < 1) {
    iVar4 = 0;
    iVar7 = 0;
  }
  else {
    uVar10 = 0;
    iVar7 = 0;
    iVar4 = 0;
    do {
      if (((uint)uMaskS >> ((uint)uVar10 & 0x1f) & 1) == 0) {
        iVar8 = -1;
        iVar2 = iVar7 + 1;
        iVar12 = iVar7;
      }
      else {
        iVar2 = iVar7;
        iVar12 = -1;
        iVar8 = iVar4;
        iVar4 = iVar4 + 1;
      }
      iVar7 = iVar2;
      *(int *)(abStack_478 + uVar10 * 4) = iVar8;
      *(int *)(abStack_4b8 + uVar10 * 4) = iVar12;
      uVar10 = uVar10 + 1;
    } while ((uint)nVarsB != uVar10);
  }
  if (iVar4 != nVarsS) {
    __assert_fail("s == nVarsS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauNonDsd.c"
                  ,0x42,
                  "int Dau_DecCheckSetTop5(word *, int, int, int, int, int, int *, word *, word *)")
    ;
  }
  if (iVar7 != nVarsB - nVarsS) {
    __assert_fail("b == nVarsB-nVarsS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauNonDsd.c"
                  ,0x43,
                  "int Dau_DecCheckSetTop5(word *, int, int, int, int, int, int *, word *, word *)")
    ;
  }
  bVar5 = 6 - bVar6;
  uVar10 = 1;
  if (1 < (int)uVar16) {
    uVar10 = (ulong)uVar16;
  }
  uVar11 = 0;
  do {
    auStack_238[uVar11] = 0xffffffffffffffff;
    auStack_438[uVar11] = 0xffffffffffffffff;
    uVar11 = uVar11 + 1;
  } while (uVar10 != uVar11);
  if (nVarsB != 0x1f) {
    uVar10 = 1;
    if (1 < (int)uVar3) {
      uVar10 = (ulong)uVar3;
    }
    uVar11 = 0;
    uVar13 = 0;
    uVar3 = 0;
    uVar9 = 0;
    do {
      uVar15 = p[(int)uVar9 >> (bVar5 & 0x1f)] >> ((byte)(uVar9 << (bVar6 & 0x1f)) & 0x3f) &
               ~(-1L << ((byte)(1 << (bVar6 & 0x1f)) & 0x3f));
      if ((auStack_438[(int)uVar13] == 0xffffffffffffffff) || (auStack_438[(int)uVar13] == uVar15))
      {
        auStack_438[(int)uVar13] = uVar15;
      }
      else {
        if ((auStack_238[(int)uVar13] != 0xffffffffffffffff) && (auStack_238[(int)uVar13] != uVar15)
           ) {
          return 0;
        }
        auStack_238[(int)uVar13] = uVar15;
        if (pDec != (word *)0x0) {
          iVar4 = (uVar13 << ((byte)(nVarsB - nVarsS) & 0x1f)) + uVar3;
          pDec[iVar4 >> 6] = pDec[iVar4 >> 6] | 1L << ((byte)iVar4 & 0x3f);
        }
      }
      uVar1 = pSched[uVar11];
      if (((uint)uMaskS >> (uVar1 & 0x1f) & 1) == 0) {
        uVar3 = uVar3 ^ 1 << (abStack_4b8[(long)(int)uVar1 * 4] & 0x1f);
      }
      else {
        uVar13 = uVar13 ^ 1 << (abStack_478[(long)(int)uVar1 * 4] & 0x1f);
      }
      uVar9 = uVar9 ^ 1 << (uVar1 & 0x1f);
      uVar11 = uVar11 + 1;
    } while (uVar10 != uVar11);
  }
  if (pComp != (word *)0x0) {
    uVar10 = 1;
    if (1 < (int)uVar16) {
      uVar10 = (ulong)uVar16;
    }
    uVar11 = 0;
    do {
      uVar15 = auStack_438[uVar11];
      uVar3 = (uint)uVar11;
      pComp[uVar3 >> (bVar5 & 0x1f)] =
           pComp[uVar3 >> (bVar5 & 0x1f)] | uVar15 << ((byte)(uVar3 << (bVar6 & 0x1f)) & 0x3f);
      uVar14 = auStack_238[uVar11];
      if (auStack_238[uVar11] == 0xffffffffffffffff) {
        uVar14 = uVar15;
      }
      pComp[(int)(uVar16 + uVar3) >> (bVar5 & 0x1f)] =
           pComp[(int)(uVar16 + uVar3) >> (bVar5 & 0x1f)] |
           uVar14 << ((byte)(uVar16 + uVar3 << (bVar6 & 0x1f)) & 0x3f);
      uVar11 = uVar11 + 1;
    } while (uVar10 != uVar11);
    iVar4 = nVarsS + nVarsF;
    if (iVar4 < 5) {
      if (iVar4 < -1) goto LAB_005166a2;
      uVar16 = iVar4 + 1;
      uVar3 = 4;
      if (4 < uVar16) {
        uVar3 = uVar16;
      }
      if (2 < uVar3 - 4) goto LAB_005166c1;
      uVar10 = *pComp;
      uVar9 = (uint)uVar10;
      uVar3 = -(uVar9 & 1);
      if (uVar16 != 0) {
        uVar3 = uVar9;
      }
      uVar3 = (uVar3 & 3) * 5;
      if (1 < uVar16) {
        uVar3 = uVar9;
      }
      bVar6 = (byte)(uVar3 << 4) | (byte)uVar3 & 0xf;
      if (2 < uVar16) {
        bVar6 = (byte)uVar10;
      }
      uVar3 = (uint)CONCAT11(bVar6,bVar6);
      if (3 < uVar16) {
        uVar3 = uVar9;
      }
      uVar11 = (ulong)(uVar3 << 0x10 | uVar3 & 0xffff);
      if (4 < uVar16) {
        uVar11 = uVar10;
      }
      *pComp = uVar11 << 0x20 | uVar11 & 0xffffffff;
    }
  }
  if (nVarsB < 6 && pDec != (word *)0x0) {
    if (nVarsB < 0) {
LAB_005166a2:
      __assert_fail("nVars >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x489,"word Abc_Tt6Stretch(word, int)");
    }
    iVar4 = 4;
    if (4 < (uint)nVarsB) {
      iVar4 = nVarsB;
    }
    if (2 < iVar4 - 4U) {
LAB_005166c1:
      __assert_fail("nVars == 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x496,"word Abc_Tt6Stretch(word, int)");
    }
    uVar10 = *pDec;
    uVar16 = (uint)uVar10;
    uVar3 = -(uVar16 & 1);
    if (nVarsB != 0) {
      uVar3 = uVar16;
    }
    uVar3 = (uVar3 & 3) * 5;
    if (1 < (uint)nVarsB) {
      uVar3 = uVar16;
    }
    bVar6 = (byte)(uVar3 << 4) | (byte)uVar3 & 0xf;
    if (2 < (uint)nVarsB) {
      bVar6 = (byte)uVar10;
    }
    uVar3 = (uint)CONCAT11(bVar6,bVar6);
    if (3 < (uint)nVarsB) {
      uVar3 = uVar16;
    }
    uVar11 = (ulong)(uVar3 << 0x10 | uVar3 & 0xffff);
    if (4 < (uint)nVarsB) {
      uVar11 = uVar10;
    }
    *pDec = uVar11 << 0x20 | uVar11 & 0xffffffff;
  }
  return 1;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////
 
/**Function*************************************************************

  Synopsis    [Checks decomposability with given variable set.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Dau_DecCheckSetTop5( word * p, int nVars, int nVarsF, int nVarsB, int nVarsS, int uMaskS, int * pSched, word * pDec, word * pComp )
{
    word Cof[2][64], Value;
    word MaskFF = (((word)1) << (1 << nVarsF)) - 1;
    int ShiftF = 6 - nVarsF, MaskF = (1 << ShiftF) - 1;
    int pVarsS[16], pVarsB[16];
    int nMints  = (1 << nVarsB);
    int nMintsB = (1 <<(nVarsB-nVarsS));
    int nMintsS = (1 << nVarsS);
    int s, b, v, m, Mint, MintB, MintS;
    assert( nVars == nVarsB + nVarsF );
    assert( nVars <= 16 );
    assert( nVarsS <= 6 );
    assert( nVarsF >= 1 && nVarsF <= 5 );
    // collect bound/shared variables
    for ( s = b = v = 0; v < nVarsB; v++ )
        if ( (uMaskS >> v) & 1 )
            pVarsB[v] = -1, pVarsS[v] = s++;
        else
            pVarsS[v] = -1, pVarsB[v] = b++;
    assert( s == nVarsS );
    assert( b == nVarsB-nVarsS );
    // clean minterm storage
    for ( s = 0; s < nMintsS; s++ )
        Cof[0][s] = Cof[1][s] = ~(word)0;
    // iterate through bound set minters
    for ( MintS = MintB = Mint = m = 0; m < nMints; m++ )
    {
        // find minterm value
        Value = (p[Mint>>ShiftF] >> ((Mint&MaskF)<<nVarsF)) & MaskFF;
        // check if this cof already appeared 
        if ( !~Cof[0][MintS] || Cof[0][MintS] == Value )
            Cof[0][MintS] = Value;
        else if ( !~Cof[1][MintS] || Cof[1][MintS] == Value )
        {
            Cof[1][MintS] = Value;
            if ( pDec ) 
            {
                int iMintB = MintS * nMintsB + MintB;
                pDec[iMintB>>6] |= (((word)1)<<(iMintB & 63));     
            }
        }
        else
            return 0;            
        // find next minterm
        v = pSched[m];
        Mint ^= (1 << v);
        if ( (uMaskS >> v) & 1 ) // shared variable
            MintS ^= (1 << pVarsS[v]);
        else
            MintB ^= (1 << pVarsB[v]);
    }
    // create composition function
    if ( pComp )
    {
        for ( s = 0; s < nMintsS; s++ )
        {
            pComp[s>>ShiftF] |= (Cof[0][s] << ((s&MaskF) << nVarsF));
            if ( ~Cof[1][s] ) 
                pComp[(s+nMintsS)>>ShiftF] |= (Cof[1][s] << (((s+nMintsS)&MaskF) << nVarsF));
            else
                pComp[(s+nMintsS)>>ShiftF] |= (Cof[0][s] << (((s+nMintsS)&MaskF) << nVarsF));
        }
        if ( nVarsF + nVarsS + 1 < 6 )
            pComp[0] = Abc_Tt6Stretch( pComp[0], nVarsF + nVarsS + 1 );
    }
    if ( pDec && nVarsB < 6 )
        pDec[0] = Abc_Tt6Stretch( pDec[0], nVarsB );
    return 1;
}